

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_sweep(gray_PWorker worker)

{
  uchar *puVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  uchar *local_50;
  uchar *q_1;
  uchar *q;
  TArea area;
  uchar *line;
  TArea cover;
  TCoord x;
  PCell_conflict cell;
  uint local_18;
  int y;
  int coverage;
  int fill;
  gray_PWorker worker_local;
  
  uVar3 = 0x80000000;
  if (((worker->outline).flags & 2U) != 0) {
    uVar3 = 0x100;
  }
  cell._4_4_ = worker->min_ey;
  do {
    if (worker->max_ey <= cell._4_4_) {
      return;
    }
    _cover = worker->ycells[cell._4_4_ - worker->min_ey];
    line._4_4_ = worker->min_ex;
    line._0_4_ = 0;
    puVar1 = (worker->target).origin;
    iVar6 = (worker->target).pitch * cell._4_4_;
    for (; local_18 = (int)line >> 9, _cover != worker->cell_null; _cover = _cover->next) {
      if (((int)line != 0) && (line._4_4_ < _cover->x)) {
        if ((local_18 & uVar3) != 0) {
          local_18 = local_18 ^ 0xffffffff;
        }
        if ((0xff < (int)local_18) && ((uVar3 & 0x80000000) != 0)) {
          local_18 = 0xff;
        }
        puVar5 = puVar1 + ((long)line._4_4_ - (long)iVar6);
        uVar2 = (uchar)local_18;
        q_1 = puVar5;
        switch(_cover->x - line._4_4_) {
        case 7:
          q_1 = puVar5 + 1;
          *puVar5 = uVar2;
        case 6:
          *q_1 = uVar2;
          q_1 = q_1 + 1;
        case 5:
          *q_1 = uVar2;
          q_1 = q_1 + 1;
        case 4:
          *q_1 = uVar2;
          q_1 = q_1 + 1;
        case 3:
          *q_1 = uVar2;
          q_1 = q_1 + 1;
        case 2:
          *q_1 = uVar2;
          q_1 = q_1 + 1;
        case 1:
          *q_1 = uVar2;
        case 0:
          break;
        default:
          memset(puVar1 + ((long)line._4_4_ - (long)iVar6),local_18 & 0xff,
                 (long)(_cover->x - line._4_4_));
        }
      }
      line._0_4_ = _cover->cover * 0x200 + (int)line;
      iVar4 = (int)line - _cover->area;
      if ((iVar4 != 0) && (worker->min_ex <= _cover->x)) {
        local_18 = iVar4 >> 9;
        if ((local_18 & uVar3) != 0) {
          local_18 = local_18 ^ 0xffffffff;
        }
        if ((0xff < (int)local_18) && ((uVar3 & 0x80000000) != 0)) {
          local_18 = 0xff;
        }
        puVar1[(long)_cover->x - (long)iVar6] = (uchar)local_18;
      }
      line._4_4_ = _cover->x + 1;
    }
    if ((int)line != 0) {
      if ((local_18 & uVar3) != 0) {
        local_18 = local_18 ^ 0xffffffff;
      }
      if ((0xff < (int)local_18) && ((uVar3 & 0x80000000) != 0)) {
        local_18 = 0xff;
      }
      puVar5 = puVar1 + ((long)line._4_4_ - (long)iVar6);
      uVar2 = (uchar)local_18;
      local_50 = puVar5;
      switch(worker->max_ex - line._4_4_) {
      case 7:
        local_50 = puVar5 + 1;
        *puVar5 = uVar2;
      case 6:
        *local_50 = uVar2;
        local_50 = local_50 + 1;
      case 5:
        *local_50 = uVar2;
        local_50 = local_50 + 1;
      case 4:
        *local_50 = uVar2;
        local_50 = local_50 + 1;
      case 3:
        *local_50 = uVar2;
        local_50 = local_50 + 1;
      case 2:
        *local_50 = uVar2;
        local_50 = local_50 + 1;
      case 1:
        *local_50 = uVar2;
      case 0:
        break;
      default:
        memset(puVar1 + ((long)line._4_4_ - (long)iVar6),local_18 & 0xff,
               (long)(worker->max_ex - line._4_4_));
      }
    }
    cell._4_4_ = cell._4_4_ + 1;
  } while( true );
}

Assistant:

static void
  gray_sweep( RAS_ARG )
  {
    int  fill = ( ras.outline.flags & FT_OUTLINE_EVEN_ODD_FILL ) ? 0x100
                                                                 : INT_MIN;
    int  coverage;
    int  y;


    for ( y = ras.min_ey; y < ras.max_ey; y++ )
    {
      PCell   cell  = ras.ycells[y - ras.min_ey];
      TCoord  x     = ras.min_ex;
      TArea   cover = 0;

      unsigned char*  line = ras.target.origin - ras.target.pitch * y;


      for ( ; cell != ras.cell_null; cell = cell->next )
      {
        TArea  area;


        if ( cover != 0 && cell->x > x )
        {
          FT_FILL_RULE( coverage, cover, fill );
          FT_GRAY_SET( line + x, coverage, cell->x - x );
        }

        cover += (TArea)cell->cover * ( ONE_PIXEL * 2 );
        area   = cover - cell->area;

        if ( area != 0 && cell->x >= ras.min_ex )
        {
          FT_FILL_RULE( coverage, area, fill );
          line[cell->x] = (unsigned char)coverage;
        }

        x = cell->x + 1;
      }

      if ( cover != 0 )  /* only if cropped */
      {
        FT_FILL_RULE( coverage, cover, fill );
        FT_GRAY_SET( line + x, coverage, ras.max_ex - x );
      }
    }
  }